

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::clearEditText(QComboBox *this)

{
  QComboBoxPrivate *pQVar1;
  long in_FS_OFFSET;
  QComboBoxPrivate *d;
  QAccessibleValueChangeEvent event;
  QLineEdit *in_stack_ffffffffffffff50;
  QVariant *this_00;
  QObject *obj;
  QAccessibleValueChangeEvent *this_01;
  QObject local_80 [24];
  QVariant local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QComboBox *)0x53be20);
  if (pQVar1->lineEdit != (QLineEdit *)0x0) {
    QLineEdit::clear(in_stack_ffffffffffffff50);
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  obj = local_80;
  QString::QString((QString *)0x53be78);
  this_00 = &local_68;
  ::QVariant::QVariant(this_00,(QString *)obj);
  this_01 = (QAccessibleValueChangeEvent *)&local_48;
  QAccessibleValueChangeEvent::QAccessibleValueChangeEvent(this_01,obj,this_00);
  ::QVariant::~QVariant(this_00);
  QString::~QString((QString *)0x53beb9);
  QAccessible::updateAccessibility((QAccessibleEvent *)this_01);
  QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::clearEditText()
{
    Q_D(QComboBox);
    if (d->lineEdit)
        d->lineEdit->clear();
#if QT_CONFIG(accessibility)
    QAccessibleValueChangeEvent event(this, QString());
    QAccessible::updateAccessibility(&event);
#endif
}